

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_name_cmp(mbedtls_x509_name *a,mbedtls_x509_name *b)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  int iVar3;
  int iVar4;
  
  while( true ) {
    if (a == (mbedtls_x509_name *)0x0 && b == (mbedtls_x509_name *)0x0) {
      return 0;
    }
    if (a == (mbedtls_x509_name *)0x0) {
      return -1;
    }
    if (b == (mbedtls_x509_name *)0x0) {
      return -1;
    }
    if ((a->oid).tag != (b->oid).tag) break;
    sVar2 = (a->oid).len;
    if (sVar2 != (b->oid).len) {
      return -1;
    }
    iVar3 = bcmp((a->oid).p,(b->oid).p,sVar2);
    if (iVar3 != 0) {
      return -1;
    }
    iVar3 = (a->val).tag;
    iVar1 = (b->val).tag;
    if (((iVar3 != iVar1) || (sVar2 = (a->val).len, sVar2 != (b->val).len)) ||
       (iVar4 = bcmp((a->val).p,(b->val).p,sVar2), iVar4 != 0)) {
      if ((iVar3 != 0x13) && (iVar3 != 0xc)) {
        return -1;
      }
      if ((iVar1 != 0x13) && (iVar1 != 0xc)) {
        return -1;
      }
      len = (a->val).len;
      if (len != (b->val).len) {
        return -1;
      }
      iVar3 = x509_memcasecmp((a->val).p,(b->val).p,len);
      if (iVar3 != 0) {
        return -1;
      }
    }
    if (a->next_merged != b->next_merged) {
      return -1;
    }
    a = a->next;
    b = b->next;
  }
  return -1;
}

Assistant:

static int x509_name_cmp( const mbedtls_x509_name *a, const mbedtls_x509_name *b )
{
    /* Avoid recursion, it might not be optimised by the compiler */
    while( a != NULL || b != NULL )
    {
        if( a == NULL || b == NULL )
            return( -1 );

        /* type */
        if( a->oid.tag != b->oid.tag ||
            a->oid.len != b->oid.len ||
            memcmp( a->oid.p, b->oid.p, b->oid.len ) != 0 )
        {
            return( -1 );
        }

        /* value */
        if( x509_string_cmp( &a->val, &b->val ) != 0 )
            return( -1 );

        /* structure of the list of sets */
        if( a->next_merged != b->next_merged )
            return( -1 );

        a = a->next;
        b = b->next;
    }

    /* a == NULL == b */
    return( 0 );
}